

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall CP::vector<int>::expand(vector<int> *this,size_t capacity)

{
  size_t sVar1;
  int *piVar2;
  int *__s;
  size_t sVar3;
  ulong __n;
  
  __n = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  sVar1 = this->mSize;
  if (sVar1 != 0) {
    piVar2 = this->mData;
    sVar3 = 0;
    do {
      __s[sVar3] = piVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  if (this->mData != (int *)0x0) {
    operator_delete__(this->mData);
  }
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }